

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_stats.cpp
# Opt level: O1

void __thiscall
duckdb::SerializeNumericStatsValue
          (duckdb *this,LogicalType *type,NumericValueUnion val,bool has_value,
          Serializer *serializer)

{
  duckdb dVar1;
  long *plVar2;
  InternalException *this_00;
  undefined7 in_register_00000081;
  int iVar3;
  uint uVar4;
  uint uVar5;
  string local_48;
  
  plVar2 = (long *)CONCAT71(in_register_00000081,has_value);
  (**(code **)(*(long *)CONCAT71(in_register_00000081,has_value) + 0x10))
            (CONCAT71(in_register_00000081,has_value),100,"has_value");
  (**(code **)(*plVar2 + 0x70))(plVar2,val.value_._8_4_);
  (**(code **)(*plVar2 + 0x18))(plVar2);
  if (val.value_._8_4_ == 0) {
    return;
  }
  dVar1 = this[1];
  uVar5 = (uint)((ulong)type >> 8);
  iVar3 = (int)((ulong)type >> 0x10);
  uVar4 = (uint)type;
  switch(dVar1) {
  case (duckdb)0x1:
    (**(code **)(*plVar2 + 0x10))(plVar2,0x65,"value");
    (**(code **)(*plVar2 + 0x70))(plVar2,uVar4 & 1);
    break;
  case (duckdb)0x2:
    (**(code **)(*plVar2 + 0x10))(plVar2,0x65,"value");
    (**(code **)(*plVar2 + 0x78))(plVar2,(ulong)type & 0xff);
    break;
  case (duckdb)0x3:
    (**(code **)(*plVar2 + 0x10))(plVar2,0x65,"value");
    (**(code **)(*plVar2 + 0x80))(plVar2,(int)(char)type);
    break;
  case (duckdb)0x4:
    (**(code **)(*plVar2 + 0x10))(plVar2,0x65,"value");
    (**(code **)(*plVar2 + 0x88))(plVar2,uVar4 & 0xff | (uVar5 & 0xff) << 8);
    break;
  case (duckdb)0x5:
    (**(code **)(*plVar2 + 0x10))(plVar2,0x65,"value");
    (**(code **)(*plVar2 + 0x90))(plVar2,(int)(short)((ushort)type & 0xff | (ushort)(uVar5 << 8)));
    break;
  case (duckdb)0x6:
    (**(code **)(*plVar2 + 0x10))(plVar2,0x65,"value");
    (**(code **)(*plVar2 + 0x98))(plVar2,(uVar5 & 0xff) << 8 | uVar4 & 0xff | iVar3 << 0x10);
    break;
  case (duckdb)0x7:
    (**(code **)(*plVar2 + 0x10))(plVar2,0x65,"value");
    (**(code **)(*plVar2 + 0xa0))(plVar2,(uVar5 & 0xff) << 8 | uVar4 & 0xff | iVar3 << 0x10);
    break;
  case (duckdb)0x8:
    (**(code **)(*plVar2 + 0x10))(plVar2,0x65,"value");
    (**(code **)(*plVar2 + 0xa8))(plVar2,type);
    break;
  case (duckdb)0x9:
    (**(code **)(*plVar2 + 0x10))(plVar2,0x65,"value");
    (**(code **)(*plVar2 + 0xb0))(plVar2,type);
    break;
  case (duckdb)0xa:
switchD_005fcaa4_caseD_a:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Unsupported type for serializing numeric statistics","");
    InternalException::InternalException(this_00,&local_48);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case (duckdb)0xb:
    (**(code **)(*plVar2 + 0x10))(plVar2,0x65,"value");
    (**(code **)(*plVar2 + 200))((uVar5 & 0xff) << 8 | uVar4 & 0xff | iVar3 << 0x10,plVar2);
    break;
  case (duckdb)0xc:
    (**(code **)(*plVar2 + 0x10))(plVar2,0x65,"value");
    (**(code **)(*plVar2 + 0xd0))(type,plVar2);
    break;
  default:
    if (dVar1 == (duckdb)0xcb) {
      (**(code **)(*plVar2 + 0x10))(plVar2,0x65,"value");
      (**(code **)(*plVar2 + 0xc0))(plVar2,type,val.value_.bigint);
    }
    else {
      if (dVar1 != (duckdb)0xcc) goto switchD_005fcaa4_caseD_a;
      (**(code **)(*plVar2 + 0x10))(plVar2,0x65,"value");
      (**(code **)(*plVar2 + 0xb8))(plVar2,type,val.value_.bigint);
    }
  }
  (**(code **)(*plVar2 + 0x18))(plVar2);
  return;
}

Assistant:

static void SerializeNumericStatsValue(const LogicalType &type, NumericValueUnion val, bool has_value,
                                       Serializer &serializer) {
	serializer.WriteProperty(100, "has_value", has_value);
	if (!has_value) {
		return;
	}
	switch (type.InternalType()) {
	case PhysicalType::BOOL:
		serializer.WriteProperty(101, "value", val.value_.boolean);
		break;
	case PhysicalType::INT8:
		serializer.WriteProperty(101, "value", val.value_.tinyint);
		break;
	case PhysicalType::INT16:
		serializer.WriteProperty(101, "value", val.value_.smallint);
		break;
	case PhysicalType::INT32:
		serializer.WriteProperty(101, "value", val.value_.integer);
		break;
	case PhysicalType::INT64:
		serializer.WriteProperty(101, "value", val.value_.bigint);
		break;
	case PhysicalType::UINT8:
		serializer.WriteProperty(101, "value", val.value_.utinyint);
		break;
	case PhysicalType::UINT16:
		serializer.WriteProperty(101, "value", val.value_.usmallint);
		break;
	case PhysicalType::UINT32:
		serializer.WriteProperty(101, "value", val.value_.uinteger);
		break;
	case PhysicalType::UINT64:
		serializer.WriteProperty(101, "value", val.value_.ubigint);
		break;
	case PhysicalType::INT128:
		serializer.WriteProperty(101, "value", val.value_.hugeint);
		break;
	case PhysicalType::UINT128:
		serializer.WriteProperty(101, "value", val.value_.uhugeint);
		break;
	case PhysicalType::FLOAT:
		serializer.WriteProperty(101, "value", val.value_.float_);
		break;
	case PhysicalType::DOUBLE:
		serializer.WriteProperty(101, "value", val.value_.double_);
		break;
	default:
		throw InternalException("Unsupported type for serializing numeric statistics");
	}
}